

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

optional<int>
slang::ast::bindArrayIndexSetter
          (ASTContext *context,Expression *keyExpr,Type *elementType,ExpressionSyntax *valueSyntax,
          SmallMap<int,_const_slang::ast::Expression_*,_8UL,_ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>
          *indexMap,
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
          *indexSetters)

{
  bool bVar1;
  SourceLocation location;
  Expression *this;
  Diagnostic *this_00;
  ulong uVar2;
  ulong uVar3;
  pair<ska::detailv3::sherwood_v3_table<std::pair<int,_const_slang::ast::Expression_*>,_int,_std::hash<int>,_ska::detailv3::KeyOrValueHasher<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::hash<int>_>,_std::equal_to<int>,_ska::detailv3::KeyOrValueEquality<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::equal_to<int>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_>,_bool>
  pVar4;
  optional<int> index;
  _Storage<int,_true> local_60 [2];
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *local_58;
  undefined1 local_50 [16];
  Expression *local_40;
  Expression *local_38;
  
  local_60 = (_Storage<int,_true>  [2])ASTContext::evalInteger(context,keyExpr);
  if (((ulong)local_60 >> 0x20 & 1) != 0) {
    local_58 = indexSetters;
    local_50 = (undefined1  [16])
               slang::syntax::SyntaxNode::getFirstToken(&valueSyntax->super_SyntaxNode);
    location = parsing::Token::location((Token *)local_50);
    uVar3 = 0;
    this = Expression::bindRValue
                     (elementType,valueSyntax,location,context,(bitmask<slang::ast::ASTFlags>)0x0);
    bVar1 = Expression::bad(this);
    uVar2 = 0;
    if (bVar1) goto LAB_0030c436;
    local_50._0_8_ = this;
    pVar4 = ska::detailv3::
            sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
            ::emplace<int&,slang::ast::Expression_const*>
                      ((sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
                        *)&indexMap->
                           super_flat_hash_map<int,_const_slang::ast::Expression_*,_std::hash<int>,_std::equal_to<int>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>
                       ,&local_60[0]._M_value,(Expression **)local_50);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar2 = 0x100000000;
      local_38 = keyExpr;
      not_null<slang::ast::Expression_const*>::not_null<slang::ast::Expression_const*,void>
                ((not_null<slang::ast::Expression_const*> *)local_50,&local_38);
      local_40 = this;
      not_null<slang::ast::Expression_const*>::not_null<slang::ast::Expression_const*,void>
                ((not_null<slang::ast::Expression_const*> *)(local_50 + 8),&local_40);
      SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::
      emplace_back<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                (local_58,(IndexSetter *)local_50);
      uVar3 = (ulong)local_60 & 0xffffffff;
      goto LAB_0030c436;
    }
    this_00 = ASTContext::addDiag(context,(DiagCode)0x110007,keyExpr->sourceRange);
    Diagnostic::operator<<(this_00,local_60[0]._M_value);
    Diagnostic::addNote(this_00,(DiagCode)0x80001,
                        (((pVar4.first.current.current)->field_1).value.second)->sourceRange);
  }
  uVar3 = 0;
  uVar2 = 0;
LAB_0030c436:
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)(uVar3 | uVar2);
}

Assistant:

static std::optional<int32_t> bindArrayIndexSetter(
    const ASTContext& context, const Expression& keyExpr, const Type& elementType,
    const ExpressionSyntax& valueSyntax, SmallMap<int32_t, const Expression*, 8>& indexMap,
    SmallVectorBase<StructuredAssignmentPatternExpression::IndexSetter>& indexSetters) {

    std::optional<int32_t> index = context.evalInteger(keyExpr);
    if (!index)
        return std::nullopt;

    auto& expr = Expression::bindRValue(elementType, valueSyntax,
                                        valueSyntax.getFirstToken().location(), context);
    if (expr.bad())
        return std::nullopt;

    auto [it, inserted] = indexMap.emplace(*index, &expr);
    if (!inserted) {
        auto& diag = context.addDiag(diag::AssignmentPatternKeyDupValue, keyExpr.sourceRange);
        diag << *index;
        diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
        return std::nullopt;
    }

    indexSetters.push_back({&keyExpr, &expr});
    return *index;
}